

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ca77ac::UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test::
TestBody(UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  TestNestedMessageRedaction *pTVar4;
  char *message;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  Message *message_00;
  AssertHelper local_248;
  Message local_240;
  string local_238;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  TestNestedMessageRedaction unredacted_nested_proto;
  undefined1 local_180 [8];
  TestNestedMessageRedaction redacted_nested_proto;
  RedactedFields proto;
  UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test *this_local;
  
  proto2_unittest::RedactedFields::RedactedFields
            ((RedactedFields *)
             &redacted_nested_proto.field_0._impl_.optional_redacted_nested_string_);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_180);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)&gtest_ar.message_);
  puVar2 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &redacted_nested_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)local_180);
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)&redacted_nested_proto.field_0._impl_,anon_var_dwarf_d26366 + 0xf,
             pAVar3);
  puVar2 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &unredacted_nested_proto.super_Message.super_MessageLite._internal_metadata_,0
                     );
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)&gtest_ar.message_);
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)&unredacted_nested_proto.field_0._impl_,anon_var_dwarf_d26366 + 0xf,
             pAVar3);
  pTVar4 = proto2_unittest::RedactedFields::mutable_optional_redacted_message
                     ((RedactedFields *)
                      &redacted_nested_proto.field_0._impl_.optional_redacted_nested_string_);
  proto2_unittest::TestNestedMessageRedaction::operator=
            (pTVar4,(TestNestedMessageRedaction *)local_180);
  pTVar4 = proto2_unittest::RedactedFields::mutable_optional_unredacted_message
                     ((RedactedFields *)
                      &redacted_nested_proto.field_0._impl_.optional_redacted_nested_string_);
  proto2_unittest::TestNestedMessageRedaction::operator=
            (pTVar4,(TestNestedMessageRedaction *)&gtest_ar.message_);
  testing::StrEq<char[155]>(&local_218,&anon_var_dwarf_ca9c37);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
            (&local_1f0,(internal *)&local_218,matcher);
  google::protobuf::util::UnredactedUtf8DebugFormatForTest_abi_cxx11_
            (&local_238,
             (util *)&redacted_nested_proto.field_0._impl_.optional_redacted_nested_string_,
             message_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
  ::operator()(local_1c8,(char *)&local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "UnredactedUtf8DebugFormatForTest(proto)");
  std::__cxx11::string::~string((string *)&local_238);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_1f0);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unredacted_debug_format_for_test_test.cc"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)&gtest_ar.message_);
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_180);
  proto2_unittest::RedactedFields::~RedactedFields
            ((RedactedFields *)
             &redacted_nested_proto.field_0._impl_.optional_redacted_nested_string_);
  return;
}

Assistant:

TEST(UnredactedDebugFormatAPITest, MessageUnredactedUtf8DebugFormat) {
  proto2_unittest::RedactedFields proto;
  proto2_unittest::TestNestedMessageRedaction redacted_nested_proto;
  proto2_unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  unredacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;

  EXPECT_THAT(UnredactedUtf8DebugFormatForTest(proto),
              StrEq("optional_redacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"
                    "optional_unredacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"));
}